

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::SolverParameter::SerializeWithCachedSizes(SolverParameter *this,CodedOutputStream *output)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint uVar1;
  int iVar2;
  string *psVar3;
  char *data;
  void *pvVar4;
  Type *pTVar5;
  int *piVar6;
  Type *value;
  Type *value_00;
  int iVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->train_net_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.train_net");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (1,(this->train_net_).ptr_,output);
  }
  iVar2 = (this->test_net_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    this_00 = &this->test_net_;
    iVar7 = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar7);
      data = (pTVar5->_M_dataplus)._M_p;
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar7);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar5->_M_string_length,SERIALIZE,"caffe.SolverParameter.test_net");
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar7);
      google::protobuf::internal::WireFormatLite::WriteString(2,pTVar5,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  iVar2 = (this->test_iter_).current_size_;
  if (0 < iVar2) {
    iVar7 = 0;
    do {
      piVar6 = google::protobuf::RepeatedField<int>::Get(&this->test_iter_,iVar7);
      google::protobuf::internal::WireFormatLite::WriteInt32(3,*piVar6,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(4,this->test_interval_,output);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(5,this->base_lr_,output);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(6,this->display_,output);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(7,this->max_iter_,output);
  }
  if ((uVar1 & 2) != 0) {
    psVar3 = (this->lr_policy_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.lr_policy");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (8,(this->lr_policy_).ptr_,output);
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(9,this->gamma_,output);
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(10,this->power_,output);
  }
  if ((short)uVar1 < 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0xb,this->momentum_,output);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0xc,this->weight_decay_,output);
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0xd,this->stepsize_,output);
  }
  if ((uVar1 >> 0x12 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0xe,this->snapshot_,output);
  }
  if ((uVar1 & 4) != 0) {
    psVar3 = (this->snapshot_prefix_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.snapshot_prefix");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xf,(this->snapshot_prefix_).ptr_,output);
  }
  if ((uVar1 >> 0x15 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x10,this->snapshot_diff_,output);
  }
  if ((uVar1 >> 0x1a & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(0x11,this->solver_mode_,output);
  }
  if ((uVar1 >> 0x13 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x12,this->device_id_,output);
  }
  if ((uVar1 >> 0x14 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x13,this->test_compute_loss_,output);
  }
  if ((uVar1 >> 0x19 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(0x14,this->random_seed_,output);
  }
  if ((uVar1 & 0x40) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x15,(MessageLite *)this->train_net_param_,output);
  }
  iVar2 = (this->test_net_param_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar7 = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::NetParameter>::TypeHandler>
                        (&(this->test_net_param_).super_RepeatedPtrFieldBase,iVar7);
      google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
                (0x16,(MessageLite *)value,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  if ((uVar1 >> 0x16 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x17,this->debug_info_,output);
  }
  if ((uVar1 & 8) != 0) {
    psVar3 = (this->net_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.net");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x18,(this->net_).ptr_,output);
  }
  if ((char)uVar1 < '\0') {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x19,(MessageLite *)this->net_param_,output);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x1a,(MessageLite *)this->train_state_,output);
  }
  iVar2 = (this->test_state_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar7 = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::NetState>::TypeHandler>
                           (&(this->test_state_).super_RepeatedPtrFieldBase,iVar7);
      google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
                (0x1b,(MessageLite *)value_00,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  if ((uVar1 >> 0x1c & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x1c,this->snapshot_after_train_,output);
  }
  if ((uVar1 & 0x10) != 0) {
    psVar3 = (this->regularization_type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.regularization_type");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x1d,(this->regularization_type_).ptr_,output);
  }
  if ((uVar1 >> 0x17 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(0x1e,this->solver_type_,output);
  }
  if ((uVar1 >> 0x1d & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0x1f,this->delta_,output);
  }
  if ((uVar1 >> 0x1b & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x20,this->test_initialization_,output);
  }
  if ((uVar1 >> 0x1e & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x21,this->average_loss_,output);
  }
  iVar2 = (this->stepvalue_).current_size_;
  if (0 < iVar2) {
    iVar7 = 0;
    do {
      piVar6 = google::protobuf::RepeatedField<int>::Get(&this->stepvalue_,iVar7);
      google::protobuf::internal::WireFormatLite::WriteInt32(0x22,*piVar6,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  if ((int)uVar1 < 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0x23,this->clip_gradients_,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x24,this->iter_size_,output);
  }
  if ((uVar1 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(0x25,this->snapshot_format_,output);
  }
  if ((uVar1 & 4) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0x26,this->rms_decay_,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 >> 0x18 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0x27,this->momentum2_,output);
  }
  if ((uVar1 & 0x20) != 0) {
    psVar3 = (this->type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.type");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x28,(this->type_).ptr_,output);
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    return;
  }
  google::protobuf::internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void SolverParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.SolverParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string train_net = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->train_net().data(), this->train_net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.train_net");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->train_net(), output);
  }

  // repeated string test_net = 2;
  for (int i = 0, n = this->test_net_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->test_net(i).data(), this->test_net(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.test_net");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->test_net(i), output);
  }

  // repeated int32 test_iter = 3;
  for (int i = 0, n = this->test_iter_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      3, this->test_iter(i), output);
  }

  // optional int32 test_interval = 4 [default = 0];
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(4, this->test_interval(), output);
  }

  // optional float base_lr = 5;
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(5, this->base_lr(), output);
  }

  // optional int32 display = 6;
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(6, this->display(), output);
  }

  // optional int32 max_iter = 7;
  if (cached_has_bits & 0x00001000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(7, this->max_iter(), output);
  }

  // optional string lr_policy = 8;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->lr_policy().data(), this->lr_policy().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.lr_policy");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      8, this->lr_policy(), output);
  }

  // optional float gamma = 9;
  if (cached_has_bits & 0x00002000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(9, this->gamma(), output);
  }

  // optional float power = 10;
  if (cached_has_bits & 0x00004000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(10, this->power(), output);
  }

  // optional float momentum = 11;
  if (cached_has_bits & 0x00008000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(11, this->momentum(), output);
  }

  // optional float weight_decay = 12;
  if (cached_has_bits & 0x00010000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(12, this->weight_decay(), output);
  }

  // optional int32 stepsize = 13;
  if (cached_has_bits & 0x00020000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(13, this->stepsize(), output);
  }

  // optional int32 snapshot = 14 [default = 0];
  if (cached_has_bits & 0x00040000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(14, this->snapshot(), output);
  }

  // optional string snapshot_prefix = 15;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->snapshot_prefix().data(), this->snapshot_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.snapshot_prefix");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      15, this->snapshot_prefix(), output);
  }

  // optional bool snapshot_diff = 16 [default = false];
  if (cached_has_bits & 0x00200000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(16, this->snapshot_diff(), output);
  }

  // optional .caffe.SolverParameter.SolverMode solver_mode = 17 [default = GPU];
  if (cached_has_bits & 0x04000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      17, this->solver_mode(), output);
  }

  // optional int32 device_id = 18 [default = 0];
  if (cached_has_bits & 0x00080000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(18, this->device_id(), output);
  }

  // optional bool test_compute_loss = 19 [default = false];
  if (cached_has_bits & 0x00100000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(19, this->test_compute_loss(), output);
  }

  // optional int64 random_seed = 20 [default = -1];
  if (cached_has_bits & 0x02000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(20, this->random_seed(), output);
  }

  // optional .caffe.NetParameter train_net_param = 21;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      21, *this->train_net_param_, output);
  }

  // repeated .caffe.NetParameter test_net_param = 22;
  for (unsigned int i = 0, n = this->test_net_param_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      22, this->test_net_param(i), output);
  }

  // optional bool debug_info = 23 [default = false];
  if (cached_has_bits & 0x00400000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(23, this->debug_info(), output);
  }

  // optional string net = 24;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->net().data(), this->net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.net");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      24, this->net(), output);
  }

  // optional .caffe.NetParameter net_param = 25;
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      25, *this->net_param_, output);
  }

  // optional .caffe.NetState train_state = 26;
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      26, *this->train_state_, output);
  }

  // repeated .caffe.NetState test_state = 27;
  for (unsigned int i = 0, n = this->test_state_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      27, this->test_state(i), output);
  }

  // optional bool snapshot_after_train = 28 [default = true];
  if (cached_has_bits & 0x10000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(28, this->snapshot_after_train(), output);
  }

  // optional string regularization_type = 29 [default = "L2"];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->regularization_type().data(), this->regularization_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.regularization_type");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      29, this->regularization_type(), output);
  }

  // optional .caffe.SolverParameter.SolverType solver_type = 30 [default = SGD];
  if (cached_has_bits & 0x00800000u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      30, this->solver_type(), output);
  }

  // optional float delta = 31 [default = 1e-08];
  if (cached_has_bits & 0x20000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(31, this->delta(), output);
  }

  // optional bool test_initialization = 32 [default = true];
  if (cached_has_bits & 0x08000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(32, this->test_initialization(), output);
  }

  // optional int32 average_loss = 33 [default = 1];
  if (cached_has_bits & 0x40000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(33, this->average_loss(), output);
  }

  // repeated int32 stepvalue = 34;
  for (int i = 0, n = this->stepvalue_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      34, this->stepvalue(i), output);
  }

  // optional float clip_gradients = 35 [default = -1];
  if (cached_has_bits & 0x80000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(35, this->clip_gradients(), output);
  }

  cached_has_bits = _has_bits_[1];
  // optional int32 iter_size = 36 [default = 1];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(36, this->iter_size(), output);
  }

  // optional .caffe.SolverParameter.SnapshotFormat snapshot_format = 37 [default = BINARYPROTO];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      37, this->snapshot_format(), output);
  }

  // optional float rms_decay = 38 [default = 0.99];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(38, this->rms_decay(), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional float momentum2 = 39 [default = 0.999];
  if (cached_has_bits & 0x01000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(39, this->momentum2(), output);
  }

  // optional string type = 40 [default = "SGD"];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.type");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      40, this->type(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.SolverParameter)
}